

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers_impl.h
# Opt level: O3

bool __thiscall
basisu::elemental_vector::increase_capacity
          (elemental_vector *this,uint32_t min_new_capacity,bool grow_hint,uint32_t element_size,
          object_mover pMover,bool nofail)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 uVar7;
  ulong uVar8;
  size_t __size;
  char buf [256];
  
  uVar1 = this->m_size;
  uVar2 = this->m_capacity;
  if (uVar2 < uVar1) {
    __assert_fail("m_size <= m_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                  ,0xc,
                  "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                 );
  }
  uVar8 = (ulong)min_new_capacity;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = CONCAT44(0,element_size);
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x400000000)) / auVar3,0) <= uVar8) {
    __assert_fail("min_new_capacity < (0x400000000ULL / element_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                  ,0xf,
                  "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                 );
  }
  if (min_new_capacity <= uVar2) {
    return true;
  }
  uVar6 = uVar8;
  if ((grow_hint) &&
     (uVar5 = min_new_capacity - (min_new_capacity >> 1 & 0x55555555),
     uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
     1 < ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    uVar6 = uVar8 - 1 >> 0x20 | uVar8 - 1;
    uVar6 = uVar6 >> 0x10 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = (uVar6 >> 1 | uVar6) + 1;
    if (uVar6 <= uVar2) {
      __assert_fail("new_capacity && (new_capacity > m_capacity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                    ,0x1b,
                    "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                   );
    }
    if (uVar6 < uVar8) {
      if (nofail) {
        return false;
      }
      increase_capacity();
      uVar6 = uVar8;
    }
  }
  __size = CONCAT44(0,element_size) * uVar6;
  if (pMover == (object_mover)0x0) {
    pvVar4 = realloc(this->m_p,__size);
    if (pvVar4 != (void *)0x0) goto LAB_00135765;
  }
  else {
    pvVar4 = malloc(__size);
    if (pvVar4 != (void *)0x0) {
      (*pMover)(pvVar4,this->m_p,uVar1);
      if (this->m_p != (void *)0x0) {
        free(this->m_p);
      }
LAB_00135765:
      this->m_p = pvVar4;
      this->m_capacity = (uint32_t)uVar6;
      return true;
    }
    if (nofail != false) {
      return false;
    }
    increase_capacity();
  }
  if (nofail != false) {
    return false;
  }
  uVar7 = 200;
  increase_capacity();
  g_debug_printf = uVar7;
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint32_t min_new_capacity, bool grow_hint, uint32_t element_size, object_mover pMover, bool nofail)
   {
      assert(m_size <= m_capacity);

      if (sizeof(void *) == sizeof(uint64_t))
         assert(min_new_capacity < (0x400000000ULL / element_size));
      else
         assert(min_new_capacity < (0x7FFF0000U / element_size));

      if (m_capacity >= min_new_capacity)
         return true;

      size_t new_capacity = min_new_capacity;
      if ((grow_hint) && (!helpers::is_power_of_2((uint64_t)new_capacity)))
      {
         new_capacity = (size_t)helpers::next_pow2((uint64_t)new_capacity);

         assert(new_capacity && (new_capacity > m_capacity));

         if (new_capacity < min_new_capacity)
         {
            if (nofail)
               return false;
            fprintf(stderr, "vector too large\n");
            abort();
         }
      }
            
      const size_t desired_size = element_size * new_capacity;
      size_t actual_size = 0;
      if (!pMover)
      {
         void* new_p = realloc(m_p, desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif
         m_p = new_p;
      }
      else
      {
         void* new_p = malloc(desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif

         (*pMover)(new_p, m_p, m_size);

         if (m_p)
            free(m_p);
         
         m_p = new_p;
      }

      if (actual_size > desired_size)
         m_capacity = static_cast<uint32_t>(actual_size / element_size);
      else
         m_capacity = static_cast<uint32_t>(new_capacity);

      return true;
   }